

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O2

vector<short,_std::allocator<short>_> *
get_primes<short,short>(vector<short,_std::allocator<short>_> *__return_storage_ptr__,short max)

{
  size_t i;
  long lVar1;
  size_t j;
  ulong uVar2;
  undefined6 in_register_00000032;
  size_t i_1;
  ulong uVar3;
  short local_3c;
  allocator_type local_39;
  vector<char,_std::allocator<char>_> sieve;
  
  uVar3 = (ulong)(int)CONCAT62(in_register_00000032,max);
  local_3c = CONCAT11(local_3c._1_1_,1);
  std::vector<char,_std::allocator<char>_>::vector
            (&sieve,uVar3 + 1,(value_type *)&local_3c,&local_39);
  for (lVar1 = 2; uVar2 = lVar1 * lVar1, uVar2 < uVar3 || uVar2 - uVar3 == 0; lVar1 = lVar1 + 1) {
    if (sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar1] != '\0') {
      for (; uVar2 <= uVar3; uVar2 = uVar2 + lVar1) {
        sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar2] = '\0';
      }
    }
  }
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar2 = 2; uVar2 <= uVar3; uVar2 = uVar2 + 1) {
    if (sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar2] != '\0') {
      local_3c = (short)uVar2;
      std::vector<short,_std::allocator<short>_>::emplace_back<short>
                (__return_storage_ptr__,&local_3c);
    }
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&sieve.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<divider_type> get_primes(T max) {
    size_t n = (size_t)max;
    std::vector<char> sieve(n + 1, true);

    for (size_t i = 2; i * i <= n; i++)
        if (sieve[i])
            for (size_t j = i * i; j <= n; j += i) sieve[j] = false;

    std::vector<divider_type> primes;
    for (size_t i = 2; i <= n; i++)
        if (sieve[i]) primes.push_back((T)i);

    return primes;
}